

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_around(REF_GRID ref_grid,REF_INT node,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  FILE *__s;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT RVar7;
  long lVar8;
  REF_DICT node_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_INT nodes [27];
  long local_d0;
  REF_DICT local_c8;
  REF_DICT local_c0;
  REF_DICT local_b8;
  REF_DICT local_b0;
  REF_INT local_a8 [30];
  
  uVar4 = ref_dict_create(&local_c8);
  if (uVar4 == 0) {
    uVar4 = ref_dict_create(&local_b0);
    if (uVar4 == 0) {
      uVar4 = ref_dict_create(&local_b8);
      if (uVar4 == 0) {
        if (-1 < node) {
          pRVar1 = ref_grid->cell[3];
          pRVar2 = pRVar1->ref_adj;
          if ((node < pRVar2->nnode) && (local_d0 = (long)pRVar2->first[(uint)node], local_d0 != -1)
             ) {
            local_c0 = local_b0;
            RVar7 = pRVar2->item[local_d0].ref;
            while (uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8), uVar4 == 0) {
              uVar4 = ref_dict_store(local_c0,RVar7,0);
              if (uVar4 != 0) {
                pcVar6 = "store";
                uVar5 = 0x8d;
                goto LAB_001f0004;
              }
              if (0 < pRVar1->node_per) {
                lVar8 = 0;
                do {
                  uVar4 = ref_dict_store(local_c8,local_a8[lVar8],0);
                  if (uVar4 != 0) {
                    pcVar6 = "store";
                    uVar5 = 0x8f;
                    goto LAB_001f0004;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < pRVar1->node_per);
              }
              pRVar3 = pRVar1->ref_adj->item;
              local_d0 = (long)pRVar3[(int)local_d0].next;
              if (local_d0 == -1) {
                if (node < 0) goto LAB_001f0241;
                goto LAB_001f0172;
              }
              RVar7 = pRVar3[local_d0].ref;
            }
            pcVar6 = "n";
            uVar5 = 0x8c;
            goto LAB_001f0004;
          }
LAB_001f0172:
          pRVar1 = ref_grid->cell[8];
          pRVar2 = pRVar1->ref_adj;
          if ((node < pRVar2->nnode) && (local_d0 = (long)pRVar2->first[(uint)node], local_d0 != -1)
             ) {
            local_c0 = local_b8;
            RVar7 = pRVar2->item[local_d0].ref;
            while (uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8), uVar4 == 0) {
              uVar4 = ref_dict_store(local_c0,RVar7,0);
              if (uVar4 != 0) {
                pcVar6 = "store";
                uVar5 = 0x95;
                goto LAB_001f0004;
              }
              if (0 < pRVar1->node_per) {
                lVar8 = 0;
                do {
                  uVar4 = ref_dict_store(local_c8,local_a8[lVar8],0);
                  if (uVar4 != 0) {
                    pcVar6 = "store";
                    uVar5 = 0x97;
                    goto LAB_001f0004;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < pRVar1->node_per);
              }
              pRVar3 = pRVar1->ref_adj->item;
              local_d0 = (long)pRVar3[(int)local_d0].next;
              if (local_d0 == -1) goto LAB_001f0241;
              RVar7 = pRVar3[local_d0].ref;
            }
            pcVar6 = "n";
            uVar5 = 0x94;
            goto LAB_001f0004;
          }
        }
LAB_001f0241:
        __s = fopen(filename,"w");
        if (__s == (FILE *)0x0) {
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0x9c,"ref_clump_around","unable to open file");
          return 2;
        }
        fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
        fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
        uVar4 = ref_clump_zone_around
                          ((FILE *)__s,ref_grid->cell[3],local_b0,"fetriangle",local_c8,
                           ref_grid->node,node);
        if (uVar4 == 0) {
          uVar4 = ref_clump_zone_around
                            ((FILE *)__s,ref_grid->cell[8],local_b8,"fetetrahedron",local_c8,
                             ref_grid->node,node);
          if (uVar4 == 0) {
            fclose(__s);
            uVar4 = ref_dict_free(local_b8);
            if (uVar4 == 0) {
              uVar4 = ref_dict_free(local_b0);
              if (uVar4 == 0) {
                uVar4 = ref_dict_free(local_c8);
                if (uVar4 == 0) {
                  return 0;
                }
                pcVar6 = "free nodes";
                uVar5 = 0xb3;
              }
              else {
                pcVar6 = "free tris";
                uVar5 = 0xb2;
              }
            }
            else {
              pcVar6 = "free tet";
              uVar5 = 0xb1;
            }
          }
          else {
            pcVar6 = "zone";
            uVar5 = 0xad;
          }
        }
        else {
          pcVar6 = "zone";
          uVar5 = 0xa6;
        }
      }
      else {
        pcVar6 = "create tets";
        uVar5 = 0x87;
      }
    }
    else {
      pcVar6 = "create tris";
      uVar5 = 0x86;
    }
  }
  else {
    pcVar6 = "create nodes";
    uVar5 = 0x85;
  }
LAB_001f0004:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar5,
         "ref_clump_around",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_around(REF_GRID ref_grid, REF_INT node,
                                    const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}